

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNodeVector::removeElementAt(DOMNodeVector *this,XMLSize_t index)

{
  ulong local_20;
  XMLSize_t i;
  XMLSize_t index_local;
  DOMNodeVector *this_local;
  
  local_20 = index;
  if (this->nextFreeSlot <= index) {
    __assert_fail("index < nextFreeSlot",
                  "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                  ,0x6a,"void xercesc_4_0::DOMNodeVector::removeElementAt(XMLSize_t)");
  }
  for (; local_20 < this->nextFreeSlot - 1; local_20 = local_20 + 1) {
    this->data[local_20] = this->data[local_20 + 1];
  }
  this->nextFreeSlot = this->nextFreeSlot - 1;
  return;
}

Assistant:

void DOMNodeVector::removeElementAt(XMLSize_t index) {
	assert(index < nextFreeSlot);
	for (XMLSize_t i=index; i<nextFreeSlot-1; ++i) {
		data[i] = data[i+1];
	}
	--nextFreeSlot;
}